

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void warp_vertical_filter_gamma0_delta0
               (uint8_t *pred,__m128i *tmp,ConvolveParams *conv_params,int16_t gamma,int16_t delta,
               int p_height,int p_stride,int p_width,int i,int j,int sy4,int reduce_bits_vert,
               __m128i *res_add_const,int round_bits,int offset_bits)

{
  undefined2 in_CX;
  ConvolveParams *in_RDX;
  undefined2 in_R8W;
  int in_R9D;
  int in_stack_00000018;
  int in_stack_00000028;
  int in_stack_00000040;
  int in_stack_00000048;
  __m128i res_hi;
  __m128i res_lo;
  __m128i coeffs [8];
  __m128i wt;
  __m128i round_bits_const;
  __m128i res_sub_const;
  int k;
  uint8_t *in_stack_000004d0;
  ConvolveParams *in_stack_000004d8;
  int in_stack_000004e0;
  int in_stack_000004e8;
  int in_stack_000004f0;
  int in_stack_000004f8;
  int in_stack_00000500;
  int in_stack_00000508;
  int in_stack_00000510;
  int local_130;
  longlong local_108 [6];
  int in_stack_ffffffffffffff2c;
  __m128i *in_stack_ffffffffffffff30;
  __m128i *in_stack_ffffffffffffff38;
  __m128i *in_stack_ffffffffffffff40;
  __m128i *in_stack_ffffffffffffff48;
  longlong local_88 [2];
  longlong local_78;
  __m128i *in_stack_ffffffffffffff90;
  __m128i *in_stack_ffffffffffffff98;
  __m128i *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar1;
  
  unpack_weights_and_set_round_const
            (in_RDX,in_stack_00000040,in_stack_00000048,(__m128i *)&stack0xffffffffffffff98,
             (__m128i *)&local_78,&local_88);
  prepare_vertical_filter_coeffs_gamma0(in_stack_00000028,(__m128i *)local_108);
  iVar1 = -4;
  while( true ) {
    if ((in_R9D - in_stack_00000018) + -4 < 5) {
      local_130 = (in_R9D - in_stack_00000018) + -4;
    }
    else {
      local_130 = 4;
    }
    if (local_130 <= iVar1) break;
    filter_src_pixels_vertical
              (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    store_vertical_filter_output
              ((__m128i *)in_RDX,(__m128i *)CONCAT26(in_CX,CONCAT24(in_R8W,in_R9D)),
               (__m128i *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_000004d0,
               in_stack_000004d8,in_stack_000004e0,in_stack_000004e8,in_stack_000004f0,
               in_stack_000004f8,in_stack_00000500,in_stack_00000508,in_stack_00000510);
    iVar1 = iVar1 + 1;
  }
  return;
}

Assistant:

static inline void warp_vertical_filter_gamma0_delta0(
    uint8_t *pred, __m128i *tmp, ConvolveParams *conv_params, int16_t gamma,
    int16_t delta, int p_height, int p_stride, int p_width, int i, int j,
    int sy4, const int reduce_bits_vert, const __m128i *res_add_const,
    const int round_bits, const int offset_bits) {
  (void)delta;
  (void)gamma;
  int k;
  __m128i res_sub_const, round_bits_const, wt;
  unpack_weights_and_set_round_const(conv_params, round_bits, offset_bits,
                                     &res_sub_const, &round_bits_const, &wt);

  __m128i coeffs[8];
  prepare_vertical_filter_coeffs_gamma0(sy4, coeffs);
  // Vertical filter
  for (k = -4; k < AOMMIN(4, p_height - i - 4); ++k) {
    __m128i res_lo;
    __m128i res_hi;
    filter_src_pixels_vertical(tmp, coeffs, &res_lo, &res_hi, k);

    store_vertical_filter_output(&res_lo, &res_hi, res_add_const, &wt,
                                 &res_sub_const, &round_bits_const, pred,
                                 conv_params, i, j, k, reduce_bits_vert,
                                 p_stride, p_width, round_bits);
  }
}